

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::SpaceUsed(ThreadSafeArena *this)

{
  uint64_t uVar1;
  AllocationPolicy *pAVar2;
  long lVar3;
  long local_20;
  uint64_t space_used;
  SerialArena *serial;
  ThreadSafeArena *this_local;
  
  space_used = (uint64_t)
               std::atomic<google::protobuf::internal::SerialArena_*>::load
                         ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),
                          memory_order_acquire);
  local_20 = 0;
  for (; space_used != 0; space_used = (uint64_t)SerialArena::next((SerialArena *)space_used)) {
    uVar1 = SerialArena::SpaceUsed((SerialArena *)space_used);
    local_20 = uVar1 + local_20;
  }
  pAVar2 = TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
  lVar3 = 0;
  if (pAVar2 != (AllocationPolicy *)0x0) {
    lVar3 = 0x28;
  }
  return local_20 - lVar3;
}

Assistant:

uint64_t ThreadSafeArena::SpaceUsed() const {
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  uint64_t space_used = 0;
  for (; serial; serial = serial->next()) {
    space_used += serial->SpaceUsed();
  }
  return space_used - (alloc_policy_.get() ? sizeof(AllocationPolicy) : 0);
}